

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O2

sunindextype denseGETRF(realtype **a,sunindextype m,sunindextype n,sunindextype *p)

{
  long lVar1;
  double dVar2;
  realtype rVar3;
  realtype *prVar4;
  realtype *prVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  lVar1 = 0;
  lVar9 = 0;
  if (0 < n) {
    lVar9 = n;
  }
  while( true ) {
    lVar8 = lVar1;
    if (lVar8 == lVar9) {
      return 0;
    }
    prVar4 = a[lVar8];
    lVar1 = lVar8 + 1;
    lVar10 = lVar8;
    for (lVar7 = lVar1; lVar7 < m; lVar7 = lVar7 + 1) {
      lVar6 = lVar7;
      if (ABS(prVar4[lVar7]) <= ABS(prVar4[lVar10])) {
        lVar6 = lVar10;
      }
      lVar10 = lVar6;
    }
    p[lVar8] = lVar10;
    if ((prVar4[lVar10] == 0.0) && (!NAN(prVar4[lVar10]))) break;
    if (lVar10 != lVar8) {
      for (lVar7 = 0; n != lVar7; lVar7 = lVar7 + 1) {
        prVar5 = a[lVar7];
        rVar3 = prVar5[lVar10];
        prVar5[lVar10] = prVar5[lVar8];
        prVar5[lVar8] = rVar3;
      }
    }
    dVar2 = prVar4[lVar8];
    for (lVar7 = lVar1; lVar10 = lVar1, lVar7 < m; lVar7 = lVar7 + 1) {
      prVar4[lVar7] = prVar4[lVar7] * (1.0 / dVar2);
    }
    for (; lVar10 < n; lVar10 = lVar10 + 1) {
      prVar5 = a[lVar10];
      dVar2 = prVar5[lVar8];
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        for (lVar7 = lVar1; lVar7 < m; lVar7 = lVar7 + 1) {
          prVar5[lVar7] = prVar4[lVar7] * -dVar2 + prVar5[lVar7];
        }
      }
    }
  }
  return lVar1;
}

Assistant:

sunindextype denseGETRF(realtype **a, sunindextype m, sunindextype n, sunindextype *p)
{
  sunindextype i, j, k, l;
  realtype *col_j, *col_k;
  realtype temp, mult, a_kj;

  /* k-th elimination step number */
  for (k=0; k < n; k++) {

    col_k  = a[k];

    /* find l = pivot row number */
    l=k;
    for (i=k+1; i < m; i++)
      if (SUNRabs(col_k[i]) > SUNRabs(col_k[l])) l=i;
    p[k] = l;

    /* check for zero pivot element */
    if (col_k[l] == ZERO) return(k+1);
    
    /* swap a(k,1:n) and a(l,1:n) if necessary */    
    if ( l!= k ) {
      for (i=0; i<n; i++) {
        temp = a[i][l];
        a[i][l] = a[i][k];
        a[i][k] = temp;
      }
    }

    /* Scale the elements below the diagonal in
     * column k by 1.0/a(k,k). After the above swap
     * a(k,k) holds the pivot element. This scaling
     * stores the pivot row multipliers a(i,k)/a(k,k)
     * in a(i,k), i=k+1, ..., m-1.                      
     */
    mult = ONE/col_k[k];
    for(i=k+1; i < m; i++) col_k[i] *= mult;

    /* row_i = row_i - [a(i,k)/a(k,k)] row_k, i=k+1, ..., m-1 */
    /* row k is the pivot row after swapping with row l.      */
    /* The computation is done one column at a time,          */
    /* column j=k+1, ..., n-1.                                */

    for (j=k+1; j < n; j++) {

      col_j = a[j];
      a_kj = col_j[k];

      /* a(i,j) = a(i,j) - [a(i,k)/a(k,k)]*a(k,j)  */
      /* a_kj = a(k,j), col_k[i] = - a(i,k)/a(k,k) */

      if (a_kj != ZERO) {
	for (i=k+1; i < m; i++)
	  col_j[i] -= a_kj * col_k[i];
      }
    }
  }

  /* return 0 to indicate success */

  return(0);
}